

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O0

void Sim_SimulateSeqFrame(Vec_Ptr_t *vInfo,Abc_Ntk_t *pNtk,int iFrames,int nWords,int fTransfer)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_34;
  int i;
  Abc_Obj_t *pNode;
  int fTransfer_local;
  int nWords_local;
  int iFrames_local;
  Abc_Ntk_t *pNtk_local;
  Vec_Ptr_t *vInfo_local;
  
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_34);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      Sim_UtilSimulateNodeOne(pAVar2,vInfo,nWords,iFrames * nWords);
    }
  }
  for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_34);
    Sim_UtilTransferNodeOne(pAVar2,vInfo,nWords,iFrames * nWords,0);
  }
  if (fTransfer != 0) {
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_34);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        Sim_UtilTransferNodeOne(pAVar2,vInfo,nWords,iFrames * nWords,1);
      }
    }
  }
  return;
}

Assistant:

void Sim_SimulateSeqFrame( Vec_Ptr_t * vInfo, Abc_Ntk_t * pNtk, int iFrames, int nWords, int fTransfer )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Sim_UtilSimulateNodeOne( pNode, vInfo, nWords, iFrames * nWords );
    Abc_NtkForEachPo( pNtk, pNode, i )
        Sim_UtilTransferNodeOne( pNode, vInfo, nWords, iFrames * nWords, 0 );
    if ( !fTransfer )
        return;
    Abc_NtkForEachLatch( pNtk, pNode, i )
        Sim_UtilTransferNodeOne( pNode, vInfo, nWords, iFrames * nWords, 1 );
}